

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.cpp
# Opt level: O0

float __thiscall Imath_3_2::Rand32::nextf(Rand32 *this)

{
  Rand32 *in_RDI;
  anon_union_4_2_947300a4 u;
  
  next(in_RDI);
  return (float)((uint)*(undefined8 *)in_RDI & 0x7fffff | 0x3f800000) - 1.0;
}

Assistant:

float
Rand32::nextf ()
{
    //
    // Generate single-precision floating-point values between 0.0 and 1.0:
    //
    // The exponent is set to 0x7f, which indicates a value greater than
    // or equal to 1.0, and less than 2.0.  The 23 bits of the significand
    // (mantissa) are filled with pseudo-random bits generated by
    // Rand32::next().  This results in in bit patterns between 0x3f800000
    // and 0x3fffffff, which correspond to uniformly distributed floating-
    // point values between 1.0 and 1.99999988.  Subtracting 1.0 from
    // those values produces numbers between 0.0 and 0.99999988, that is,
    // between 0.0 and 1.0-FLT_EPSILON.
    //

    next ();

    union
    {
        float        f;
        unsigned int i;
    } u;

    u.i = 0x3f800000 | (_state & 0x7fffff);
    return u.f - 1;
}